

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O3

shared_ptr<embree::Texture> __thiscall
embree::CoronaLoader::loadMap(CoronaLoader *this,Ref<embree::XML> *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XML *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pRVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  Ref<embree::XML> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  char *this_01;
  CoronaLoader *this_02;
  Ref<embree::XML> *child;
  pointer pRVar9;
  shared_ptr<embree::Texture> sVar10;
  string name;
  string mapClass;
  key_type local_98;
  string local_78;
  undefined1 local_58 [24];
  undefined1 local_40 [16];
  
  iVar5 = std::__cxx11::string::compare((char *)&in_RDX->ptr->name);
  _Var8._M_pi = extraout_RDX;
  if (iVar5 == 0) {
    this_00 = in_RDX->ptr;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"class","");
    XML::parm((string *)(local_58 + 8),this_00,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    iVar5 = std::__cxx11::string::compare(local_58 + 8);
    if (iVar5 == 0) {
      this_02 = (CoronaLoader *)in_RDX->ptr;
      paVar1 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"image","");
      XML::child((XML *)local_58,(string *)this_02);
      load<embree::FileName>((FileName *)&local_78,this_02,(Ref<embree::XML> *)local_58);
      if ((XML *)local_58._0_8_ != (XML *)0x0) {
        (*((RefCount *)local_58._0_8_)->_vptr_RefCount[3])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                      *)(xml + 0x10),&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (iVar7._M_node == (_Base_ptr)(xml + 0x11)) {
        FileName::operator+((FileName *)&local_98,(FileName *)xml,(FileName *)&local_78);
        sVar10 = Texture::load((Texture *)this,(FileName *)&local_98);
        _Var8 = sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      }
      else {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + local_78._M_string_length);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                               *)(xml + 0x10),&local_98);
        (this->path).filename._M_dataplus._M_p =
             (pointer)(pmVar6->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
        p_Var2 = (pmVar6->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        (this->path).filename._M_string_length = (size_type)p_Var2;
        _Var8._M_pi = extraout_RDX_02;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
        _Var8._M_pi = extraout_RDX_03;
      }
LAB_001a58c1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
        _Var8._M_pi = extraout_RDX_04;
      }
      bVar4 = false;
    }
    else {
      this_01 = "Reference";
      iVar5 = std::__cxx11::string::compare(local_58 + 8);
      bVar4 = true;
      _Var8._M_pi = extraout_RDX_00;
      if (iVar5 == 0) {
        load<std::__cxx11::string>(&local_78,(CoronaLoader *)this_01,in_RDX);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                               *)(xml + 10),&local_78);
        (this->path).filename._M_dataplus._M_p =
             (pointer)(pmVar6->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
        p_Var2 = (pmVar6->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        (this->path).filename._M_string_length = (size_type)p_Var2;
        _Var8._M_pi = extraout_RDX_01;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        goto LAB_001a58c1;
      }
    }
    if ((undefined1 *)local_58._8_8_ != local_40) {
      operator_delete((void *)local_58._8_8_);
      _Var8._M_pi = extraout_RDX_05;
    }
    if (!bVar4) goto LAB_001a592e;
  }
  pRVar3 = (in_RDX->ptr->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pRVar9 = (in_RDX->ptr->children).
                super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar9 != pRVar3; pRVar9 = pRVar9 + 1) {
    sVar10 = loadMap(this,xml);
    _Var8 = sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((this->path).filename._M_dataplus._M_p != (pointer)0x0) goto LAB_001a592e;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->path).filename._M_string_length;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      _Var8._M_pi = extraout_RDX_06;
    }
  }
  (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  (this->path).filename._M_string_length = 0;
LAB_001a592e:
  sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<embree::Texture>)
         sVar10.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> CoronaLoader::loadMap(const Ref<XML>& xml) 
  {
    /* process map node */
    if (xml->name == "map")
    {
      std::string mapClass = xml->parm("class");

      /* load textures */
      if (mapClass == "Texture")
      {
        const FileName src = load<FileName>(xml->child("image"));
        
        /* load images only once */
        if (textureFileMap.find(src) != textureFileMap.end())
          return textureFileMap[src];
        
        try {
          return Texture::load(path+src);
        } catch (const std::runtime_error& e) {
          std::cerr << "failed to load " << path+src << ": " << e.what() << std::endl;
        }
      }
      else if (mapClass == "Reference") {
        const std::string name = load<std::string>(xml);
        return textureMap[name];
      }
    }

    /* recurse into every unknown node to find some texture */
    for (auto& child : xml->children) {
      std::shared_ptr<Texture> texture = loadMap(child);
      if (texture) return texture;
    }
    return std::shared_ptr<Texture>();
  }